

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_exit_t::Generate(ast_exit_t *this,ostream *output,int pc)

{
  int iVar1;
  string *psVar2;
  runtime_error *this_00;
  ostream *poVar3;
  string *end_tag;
  int end_loc;
  int pc_local;
  ostream *output_local;
  ast_exit_t *this_local;
  
  iVar1 = ast_item_t::EndLocationPos(&this->super_ast_item_t);
  psVar2 = ast_item_t::EndLocationTag_abi_cxx11_(&this->super_ast_item_t);
  if (iVar1 < 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Exit statement not allowed in non-loop context");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar3 = std::operator<<(output,"jmp __end_");
  poVar3 = std::operator<<(poVar3,(string *)psVar2);
  poVar3 = std::operator<<(poVar3,"_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,"__");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return pc + 1;
}

Assistant:

int ast_exit_t::Generate(std::ostream &output, int pc) const {

    int                end_loc = this->EndLocationPos();
    const std::string& end_tag = this->EndLocationTag();

    if (end_loc < 0) 
    {
      throw std::runtime_error("Exit statement not allowed in non-loop context");
    }

    output << "jmp __end_" << end_tag << "_" << end_loc << "__" << std::endl;
    return pc + 1;
  }